

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deflate_medium.c
# Opt level: O3

block_state deflate_medium(deflate_state *s,int flush)

{
  byte bVar1;
  int iVar2;
  short sVar3;
  Pos PVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  ulong uVar8;
  ulong uVar9;
  uint32_t uVar10;
  uint uVar11;
  ulong uVar12;
  ulong uVar13;
  ushort uVar14;
  uchar *puVar15;
  uint uVar16;
  uint uVar17;
  uint32_t uVar18;
  ulong uVar19;
  ulong uVar20;
  int iVar21;
  int iVar22;
  ulong uVar23;
  ulong local_58;
  uint local_4c;
  ulong local_48;
  
  iVar2 = s->level;
  uVar19 = 0;
  local_58 = 0;
  local_48 = 0;
  uVar13 = 0;
LAB_001323ee:
  do {
    uVar9 = uVar13;
    if (s->lookahead < 0x106) {
      zng_fill_window(s);
      uVar5 = s->lookahead;
      if (flush == 0 && uVar5 < 0x106) {
        return need_more;
      }
      uVar7 = s->strstart;
      if (uVar5 == 0) {
        uVar5 = 2;
        if (uVar7 < 2) {
          uVar5 = uVar7;
        }
        s->insert = uVar5;
        if (flush == 4) {
          iVar2 = s->block_start;
          if ((long)iVar2 < 0) {
            puVar15 = (uchar *)0x0;
          }
          else {
            puVar15 = s->window + iVar2;
          }
          zng_tr_flush_block(s,(char *)puVar15,uVar7 - iVar2,1);
          s->block_start = s->strstart;
          zng_flush_pending(s->strm);
          return finish_done - (s->strm->avail_out == 0);
        }
        if (s->sym_next != 0) {
          iVar2 = s->block_start;
          if ((long)iVar2 < 0) {
            puVar15 = (uchar *)0x0;
          }
          else {
            puVar15 = s->window + iVar2;
          }
          zng_tr_flush_block(s,(char *)puVar15,uVar7 - iVar2,0);
          s->block_start = s->strstart;
          zng_flush_pending(s->strm);
          if (s->strm->avail_out == 0) {
            return need_more;
          }
        }
        return block_done;
      }
      if (uVar5 < 4) {
        uVar14 = 0;
      }
      else {
LAB_00132462:
        uVar14 = quick_insert_string(s,uVar7);
        uVar7 = s->strstart;
      }
      uVar9 = 1;
      if (((uVar14 == 0) || ((long)((ulong)uVar7 - (ulong)uVar14) < 1)) ||
         ((long)(ulong)(s->w_size - 0x106) < (long)((ulong)uVar7 - (ulong)uVar14))) {
        local_4c = 0;
      }
      else {
        uVar5 = (*functable.longest_match)(s,uVar14);
        if ((uVar5 & 0xfffc) == 0) {
          uVar5 = 1;
        }
        uVar14 = (ushort)s->match_start;
        local_4c = (uint)uVar14;
        if (uVar14 < (ushort)uVar7) {
          uVar9 = (ulong)uVar5;
          uVar20 = (ulong)uVar7;
          goto LAB_001324dc;
        }
      }
      uVar20 = (ulong)uVar7;
    }
    else {
      if (iVar2 < 5) {
LAB_00132458:
        uVar7 = s->strstart;
        goto LAB_00132462;
      }
      uVar7 = (uint)uVar19;
      local_4c = (uint)local_48;
      uVar20 = local_58;
      if ((short)uVar9 == 0) goto LAB_00132458;
    }
LAB_001324dc:
    uVar23 = uVar9 & 0xffff;
    uVar5 = (uint)uVar23;
    if (uVar5 + 4 < s->lookahead) {
      uVar6 = (uint)uVar20 + 1;
      uVar10 = uVar5 - 1 & 0xffff;
      if (uVar10 < 3) {
        if ((uVar10 != 0) && ((ushort)uVar7 <= (ushort)uVar6)) {
          insert_string(s,uVar6 & 0xffff,uVar10);
        }
      }
      else {
        uVar11 = uVar6 & 0xffff;
        if ((ushort)uVar6 < (ushort)uVar7) {
          uVar7 = uVar7 & 0xffff;
          uVar6 = uVar10 + uVar11;
          uVar10 = uVar6 - uVar7;
          uVar11 = uVar7;
          if (uVar6 < uVar7 || uVar10 == 0) goto LAB_00132505;
        }
        insert_string(s,uVar11,uVar10);
      }
    }
LAB_00132505:
    uVar7 = (uint)uVar20 & 0xffff;
    if (((iVar2 < 5) || (s->lookahead < 0x107)) ||
       (uVar10 = uVar5 + uVar7, s->window_size - 0x106 <= uVar10)) {
      uVar13 = 0;
    }
    else {
      s->strstart = uVar10;
      PVar4 = quick_insert_string(s,uVar10);
      uVar6 = s->strstart;
      uVar19 = (ulong)uVar6;
      local_48 = 0;
      uVar13 = 1;
      local_58 = uVar19;
      if (((PVar4 != 0) && (0 < (long)(uVar19 - PVar4))) &&
         ((long)(uVar19 - PVar4) <= (long)(ulong)(s->w_size - 0x106))) {
        uVar10 = (*functable.longest_match)(s,PVar4);
        uVar11 = s->match_start;
        local_48 = (ulong)uVar11;
        uVar8 = local_48 & 0xffff;
        uVar12 = uVar19 & 0xffff;
        uVar17 = (uint)uVar12;
        if (((uint)uVar8 < uVar17) && (3 < (ushort)uVar10)) {
          if ((1 < (ushort)uVar9) &&
             ((uVar5 <= (uint)uVar8 + 1 &&
              (puVar15 = s->window, puVar15[(uVar8 + 1) - uVar23] == puVar15[(uVar12 + 1) - uVar23])
              ))) {
            uVar5 = s->w_size - 0x106;
            uVar16 = uVar6 - uVar5 & 0xffff;
            if (uVar17 <= uVar5) {
              uVar16 = 0;
            }
            local_48._0_2_ = (ushort)uVar11;
            if ((((1 < (ushort)local_48) && (puVar15[uVar8 - 1] == puVar15[uVar12 - 1])) &&
                (uVar16 < uVar17)) && ((uVar10 & 0xffff) < 0x100)) {
              puVar15 = puVar15 + -2;
              uVar18 = uVar10;
              iVar21 = 0;
              while( true ) {
                uVar17 = uVar17 - 1;
                uVar13 = (ulong)(uVar18 + 1);
                iVar22 = iVar21 + -1;
                if ((puVar15[uVar8] != puVar15[uVar12]) ||
                   (sVar3 = (short)iVar21, (ushort)(sVar3 + (ushort)uVar9) == 1)) break;
                if ((uVar17 <= uVar16) ||
                   ((0xfe < (uVar18 & 0xffff) ||
                    (puVar15 = puVar15 + -1, uVar18 = uVar18 + 1, iVar21 = iVar22,
                    (ushort)((sVar3 + (ushort)local_48) - 1) < 2)))) break;
              }
              uVar5 = (int)uVar9 + iVar22;
              if (((ushort)uVar5 < 2) && ((ushort)((ushort)uVar10 - 2) != (short)iVar22)) {
                uVar19 = (ulong)(uVar6 + 1);
                uVar9 = (ulong)uVar5;
                local_58 = (ulong)(iVar22 + uVar6);
                local_48 = (ulong)(uVar11 + iVar22);
                goto LAB_001325f6;
              }
            }
          }
          uVar13 = (ulong)uVar10;
        }
      }
LAB_001325f6:
      s->strstart = uVar7;
    }
    uVar5 = (uint)uVar9;
    if ((ushort)uVar9 < 4) {
      if ((ushort)uVar9 == 0) goto LAB_001323ee;
      uVar6 = s->sym_next;
      uVar7 = 0;
      do {
        bVar1 = s->window[uVar20 & 0xffff];
        s->d_buf[uVar6] = 0;
        s->sym_next = uVar6 + 1;
        s->l_buf[uVar6] = bVar1;
        s->dyn_ltree[bVar1].fc.freq = s->dyn_ltree[bVar1].fc.freq + 1;
        uVar6 = s->sym_next;
        s->lookahead = s->lookahead - 1;
        uVar7 = uVar7 + (uVar6 == s->sym_end);
        uVar20 = (ulong)((int)uVar20 + 1);
        uVar14 = (short)uVar9 - 1;
        uVar9 = (ulong)uVar14;
      } while (uVar14 != 0);
    }
    else {
      uVar11 = uVar5 & 0xffff;
      iVar21 = uVar7 - (local_4c & 0xffff);
      uVar6 = uVar11 - 3;
      uVar7 = s->sym_next;
      s->d_buf[uVar7] = (uint16_t)iVar21;
      s->sym_next = uVar7 + 1;
      s->l_buf[uVar7] = (uchar)uVar6;
      s->matches = s->matches + 1;
      s->dyn_ltree[(ulong)""[uVar6] + 0x101].fc.freq =
           s->dyn_ltree[(ulong)""[uVar6] + 0x101].fc.freq + 1;
      uVar6 = iVar21 - 1;
      uVar7 = (uVar6 >> 7) + 0x100;
      if (uVar6 < 0x100) {
        uVar7 = uVar6;
      }
      s->dyn_dtree[""[uVar7]].fc.freq = s->dyn_dtree[""[uVar7]].fc.freq + 1;
      uVar7 = (uint)(s->sym_next == s->sym_end);
      s->lookahead = s->lookahead - uVar11;
    }
    uVar5 = (uVar5 & 0xffff) + s->strstart;
    s->strstart = uVar5;
    if (uVar7 != 0) {
      iVar21 = s->block_start;
      if ((long)iVar21 < 0) {
        puVar15 = (uchar *)0x0;
      }
      else {
        puVar15 = s->window + iVar21;
      }
      zng_tr_flush_block(s,(char *)puVar15,uVar5 - iVar21,0);
      s->block_start = s->strstart;
      zng_flush_pending(s->strm);
      if (s->strm->avail_out == 0) {
        return need_more;
      }
    }
  } while( true );
}

Assistant:

Z_INTERNAL block_state deflate_medium(deflate_state *s, int flush) {
    /* Align the first struct to start on a new cacheline, this allows us to fit both structs in one cacheline */
    ALIGNED_(16) struct match current_match;
                 struct match next_match;

    /* For levels below 5, don't check the next position for a better match */
    int early_exit = s->level < 5;

    memset(&current_match, 0, sizeof(struct match));
    memset(&next_match, 0, sizeof(struct match));

    for (;;) {
        Pos hash_head = 0;    /* head of the hash chain */
        int bflush = 0;       /* set if current block must be flushed */
        int64_t dist;

        /* Make sure that we always have enough lookahead, except
         * at the end of the input file. We need STD_MAX_MATCH bytes
         * for the next match, plus WANT_MIN_MATCH bytes to insert the
         * string following the next current_match.
         */
        if (s->lookahead < MIN_LOOKAHEAD) {
            PREFIX(fill_window)(s);
            if (s->lookahead < MIN_LOOKAHEAD && flush == Z_NO_FLUSH) {
                return need_more;
            }
            if (UNLIKELY(s->lookahead == 0))
                break; /* flush the current block */
            next_match.match_length = 0;
        }

        /* Insert the string window[strstart .. strstart+2] in the
         * dictionary, and set hash_head to the head of the hash chain:
         */

        /* If we already have a future match from a previous round, just use that */
        if (!early_exit && next_match.match_length > 0) {
            current_match = next_match;
            next_match.match_length = 0;
        } else {
            hash_head = 0;
            if (s->lookahead >= WANT_MIN_MATCH) {
                hash_head = quick_insert_string(s, s->strstart);
            }

            current_match.strstart = (uint16_t)s->strstart;
            current_match.orgstart = current_match.strstart;

            /* Find the longest match, discarding those <= prev_length.
             * At this point we have always match_length < WANT_MIN_MATCH
             */

            dist = (int64_t)s->strstart - hash_head;
            if (dist <= MAX_DIST(s) && dist > 0 && hash_head != 0) {
                /* To simplify the code, we prevent matches with the string
                 * of window index 0 (in particular we have to avoid a match
                 * of the string with itself at the start of the input file).
                 */
                current_match.match_length = (uint16_t)FUNCTABLE_CALL(longest_match)(s, hash_head);
                current_match.match_start = (uint16_t)s->match_start;
                if (UNLIKELY(current_match.match_length < WANT_MIN_MATCH))
                    current_match.match_length = 1;
                if (UNLIKELY(current_match.match_start >= current_match.strstart)) {
                    /* this can happen due to some restarts */
                    current_match.match_length = 1;
                }
            } else {
                /* Set up the match to be a 1 byte literal */
                current_match.match_start = 0;
                current_match.match_length = 1;
            }
        }

        insert_match(s, current_match);

        /* now, look ahead one */
        if (LIKELY(!early_exit && s->lookahead > MIN_LOOKAHEAD && (uint32_t)(current_match.strstart + current_match.match_length) < (s->window_size - MIN_LOOKAHEAD))) {
            s->strstart = current_match.strstart + current_match.match_length;
            hash_head = quick_insert_string(s, s->strstart);

            next_match.strstart = (uint16_t)s->strstart;
            next_match.orgstart = next_match.strstart;

            /* Find the longest match, discarding those <= prev_length.
             * At this point we have always match_length < WANT_MIN_MATCH
             */

            dist = (int64_t)s->strstart - hash_head;
            if (dist <= MAX_DIST(s) && dist > 0 && hash_head != 0) {
                /* To simplify the code, we prevent matches with the string
                 * of window index 0 (in particular we have to avoid a match
                 * of the string with itself at the start of the input file).
                 */
                next_match.match_length = (uint16_t)FUNCTABLE_CALL(longest_match)(s, hash_head);
                next_match.match_start = (uint16_t)s->match_start;
                if (UNLIKELY(next_match.match_start >= next_match.strstart)) {
                    /* this can happen due to some restarts */
                    next_match.match_length = 1;
                }
                if (next_match.match_length < WANT_MIN_MATCH)
                    next_match.match_length = 1;
                else
                    fizzle_matches(s, &current_match, &next_match);
            } else {
                /* Set up the match to be a 1 byte literal */
                next_match.match_start = 0;
                next_match.match_length = 1;
            }

            s->strstart = current_match.strstart;
        } else {
            next_match.match_length = 0;
        }

        /* now emit the current match */
        bflush = emit_match(s, current_match);

        /* move the "cursor" forward */
        s->strstart += current_match.match_length;

        if (UNLIKELY(bflush))
            FLUSH_BLOCK(s, 0);
    }
    s->insert = s->strstart < (STD_MIN_MATCH - 1) ? s->strstart : (STD_MIN_MATCH - 1);
    if (flush == Z_FINISH) {
        FLUSH_BLOCK(s, 1);
        return finish_done;
    }
    if (UNLIKELY(s->sym_next))
        FLUSH_BLOCK(s, 0);

    return block_done;
}